

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Functional::TextureCubeMipmapCase::iterate(TextureCubeMipmapCase *this)

{
  int height;
  code *pcVar1;
  RenderContext *context;
  int iVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  TextureCube *pTVar7;
  int extraout_var;
  undefined4 extraout_var_00;
  char *pcVar8;
  NotSupportedError *this_00;
  size_type sVar9;
  reference pvVar10;
  int *piVar11;
  float *pfVar12;
  reference pvVar13;
  undefined4 extraout_var_01;
  PixelFormat *pPVar14;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  qpWatchDog *watchDog;
  TestLog *pTVar15;
  MessageBuilder *pMVar16;
  bool bVar17;
  bool bVar18;
  allocator<char> local_919;
  undefined1 local_918 [6];
  bool isOk;
  allocator<char> local_8f1;
  string local_8f0;
  LogImage local_8d0;
  allocator<char> local_839;
  string local_838;
  allocator<char> local_811;
  string local_810;
  LogImage local_7f0;
  allocator<char> local_759;
  string local_758;
  allocator<char> local_731;
  string local_730;
  LogImage local_710;
  allocator<char> local_679;
  string local_678;
  allocator<char> local_651;
  string local_650;
  LogImageSet local_630;
  MessageBuilder local_5f0;
  TextureCubeView local_470;
  PixelBufferAccess local_438;
  PixelBufferAccess local_410;
  PixelBufferAccess local_3e8;
  ConstPixelBufferAccess local_3c0;
  PixelBufferAccess local_398;
  ConstPixelBufferAccess local_370;
  TextureCubeView local_348;
  undefined1 local_310 [8];
  SurfaceAccess idealDst;
  CubeFace cubeFace_1;
  int curH_1;
  int curW_1;
  int curY_1;
  int curX_1;
  int cellNdx_1;
  int local_2cc;
  Vector<int,_3> local_2c8;
  Vector<int,_4> local_2bc;
  Vector<int,_4> local_2ac;
  Vector<int,_4> local_29c;
  IVec4 local_28c;
  tcu local_27c [8];
  float local_274 [2];
  float local_26c;
  Sampler local_268;
  undefined1 local_22c [8];
  LodPrecision lodPrec;
  LookupPrecision lookupPrec;
  ReferenceParams params_1;
  int numFailedPixels;
  Surface errorMask;
  Surface referenceFrame;
  undefined1 local_fc [8];
  RenderParams params;
  CubeFace cubeFace;
  int curH;
  int curW;
  int curY;
  int curX;
  int cellNdx;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> gridLayout;
  undefined1 local_78 [8];
  Surface renderedFrame;
  vector<float,_std::allocator<float>_> texCoord;
  undefined1 local_40 [6];
  bool useLodBias;
  bool isProjected;
  RandomViewport viewport;
  Functions *gl;
  int defViewportHeight;
  int defViewportWidth;
  int texHeight;
  int texWidth;
  deUint32 magFilter;
  TextureCubeMipmapCase *this_local;
  
  pTVar7 = glu::TextureCube::getRefTexture(this->m_texture);
  iVar2 = tcu::TextureCube::getSize(pTVar7);
  pTVar7 = glu::TextureCube::getRefTexture(this->m_texture);
  iVar3 = tcu::TextureCube::getSize(pTVar7);
  viewport.width = (*this->m_renderCtx->_vptr_RenderContext[3])();
  viewport.height = extraout_var;
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pcVar8 = tcu::TestNode::getName((TestNode *)this);
  dVar5 = deStringHash(pcVar8);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)local_40,(RenderTarget *)CONCAT44(extraout_var_00,iVar4),iVar2 * 2,
             iVar3 * 2,dVar5);
  bVar17 = this->m_coordType == COORDTYPE_PROJECTED;
  bVar18 = this->m_coordType == COORDTYPE_BASIC_BIAS;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap);
  tcu::Surface::Surface((Surface *)local_78,viewport.x,viewport.y);
  if ((iVar2 * 2) / 2 <= viewport.x) {
    if ((iVar3 * 2) / 2 <= viewport.y) {
      glu::TextureCube::upload(this->m_texture);
      pcVar1 = *(code **)(viewport._8_8_ + 0xb8);
      dVar5 = glu::TextureCube::getGLTexture(this->m_texture);
      (*pcVar1)(0x8513,dVar5);
      (**(code **)(viewport._8_8_ + 0x1360))(0x8513,0x2802,this->m_wrapS);
      (**(code **)(viewport._8_8_ + 0x1360))(0x8513,0x2803,this->m_wrapT);
      (**(code **)(viewport._8_8_ + 0x1360))(0x8513,0x2801,this->m_minFilter);
      (**(code **)(viewport._8_8_ + 0x1360))(0x8513,0x2800,0x2600);
      dVar5 = (**(code **)(viewport._8_8_ + 0x800))();
      glu::checkError(dVar5,"After texture setup",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                      ,0x265);
      std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
                ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX);
      computeGridLayout((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX,
                        viewport.x,viewport.y);
      if (iterate()::s_projections == '\0') {
        iVar2 = __cxa_guard_acquire(&iterate()::s_projections);
        if (iVar2 != 0) {
          tcu::Vector<float,_4>::Vector(iterate::s_projections,1.2,1.0,0.7,1.0);
          tcu::Vector<float,_4>::Vector(iterate::s_projections + 1,1.3,0.8,0.6,1.1);
          tcu::Vector<float,_4>::Vector(iterate::s_projections + 2,0.8,1.0,1.2,0.8);
          tcu::Vector<float,_4>::Vector(iterate::s_projections + 3,1.2,1.0,1.3,0.9);
          __cxa_guard_release(&iterate()::s_projections);
        }
      }
      curY = 0;
      while( true ) {
        sVar9 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::size
                          ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                           &curX);
        if ((int)sVar9 <= curY) break;
        pvVar10 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::
                  operator[]((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                             &curX,(long)curY);
        piVar11 = tcu::Vector<int,_4>::x(pvVar10);
        iVar2 = *piVar11;
        pvVar10 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::
                  operator[]((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                             &curX,(long)curY);
        piVar11 = tcu::Vector<int,_4>::y(pvVar10);
        iVar3 = *piVar11;
        pvVar10 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::
                  operator[]((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                             &curX,(long)curY);
        piVar11 = tcu::Vector<int,_4>::z(pvVar10);
        iVar4 = *piVar11;
        pvVar10 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::
                  operator[]((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                             &curX,(long)curY);
        pfVar12 = (float *)tcu::Vector<int,_4>::w(pvVar10);
        params.colorBias.m_data[3] = *pfVar12;
        params.colorBias.m_data[2] = (float)(curY % 6);
        glu::TextureTestUtil::RenderParams::RenderParams((RenderParams *)local_fc,TEXTURETYPE_CUBE);
        glu::TextureTestUtil::computeQuadTexCoordCube
                  ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,
                   (CubeFace)params.colorBias.m_data[2]);
        if (bVar17) {
          params.texType = params.texType | TEXTURETYPE_CUBE;
          params.samplerType = (SamplerType)iterate::s_projections[curY % 4].m_data[0];
          params.flags = (deUint32)iterate::s_projections[curY % 4].m_data[1];
          params.w.m_data._0_8_ = *(undefined8 *)(iterate::s_projections[curY % 4].m_data + 2);
        }
        if (bVar18) {
          params.texType = params.texType | TEXTURETYPE_2D_ARRAY;
          params.w.m_data[2] = iterate::s_bias[curY % 8];
        }
        (**(code **)(viewport._8_8_ + 0x1a00))
                  (local_40._0_4_ + iVar2,stack0xffffffffffffffc4 + iVar3,iVar4,
                   params.colorBias.m_data[3]);
        pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,
                             0);
        deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                  (&this->m_renderer,0,pvVar13,(RenderParams *)local_fc);
        curY = curY + 1;
      }
      dVar5 = (**(code **)(viewport._8_8_ + 0x800))();
      glu::checkError(dVar5,"Draw",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                      ,0x294);
      context = this->m_renderCtx;
      tcu::Surface::getAccess
                ((PixelBufferAccess *)&referenceFrame.m_pixels.m_cap,(Surface *)local_78);
      glu::readPixels(context,local_40._0_4_,stack0xffffffffffffffc4,
                      (PixelBufferAccess *)&referenceFrame.m_pixels.m_cap);
      dVar5 = (**(code **)(viewport._8_8_ + 0x800))();
      glu::checkError(dVar5,"Read pixels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                      ,0x298);
      tcu::Surface::Surface((Surface *)&errorMask.m_pixels.m_cap,viewport.x,viewport.y);
      tcu::Surface::Surface((Surface *)&params_1.maxLevel,viewport.x,viewport.y);
      params_1.baseLevel = 0;
      glu::TextureTestUtil::ReferenceParams::ReferenceParams
                ((ReferenceParams *)&lookupPrec.colorMask,TEXTURETYPE_CUBE);
      tcu::LookupPrecision::LookupPrecision((LookupPrecision *)&lodPrec.derivateBits);
      tcu::LodPrecision::LodPrecision((LodPrecision *)local_22c,RULE_OPENGL);
      glu::mapGLSampler(&local_268,this->m_wrapS,this->m_wrapT,this->m_minFilter,0x2600);
      tcu::Sampler::operator=
                ((Sampler *)(params_1.super_RenderParams.colorBias.m_data + 2),&local_268);
      params_1.sampler.borderColor.v.uData[2]._0_1_ = 0;
      params_1.sampler.seamlessCubeMap = false;
      params_1.sampler._53_3_ = 0;
      iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
      pPVar14 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_01,iVar2));
      glu::TextureTestUtil::getCompareMask((TextureTestUtil *)&local_26c,pPVar14);
      lookupPrec.colorThreshold.m_data[2] = local_26c;
      iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
      pPVar14 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_02,iVar2));
      glu::TextureTestUtil::getBitsVec((TextureTestUtil *)&local_2ac,pPVar14);
      tcu::operator-((tcu *)&local_29c,&local_2ac,2);
      tcu::Vector<int,_4>::Vector(&local_2bc,0);
      tcu::max<int,4>((tcu *)&local_28c,&local_29c,&local_2bc);
      tcu::computeFixedPointThreshold(local_27c,&local_28c);
      lookupPrec.uvwBits.m_data._4_8_ = local_27c;
      lookupPrec.colorThreshold.m_data[0] = local_274[0];
      lookupPrec.colorThreshold.m_data[1] = local_274[1];
      if (bVar17) {
        tcu::Vector<int,_3>::Vector(&local_2c8,8);
      }
      else {
        tcu::Vector<int,_3>::Vector(&local_2c8,10);
      }
      lookupPrec.coordBits.m_data[0] = local_2c8.m_data[2];
      lodPrec.derivateBits = local_2c8.m_data[0];
      lodPrec.lodBits = local_2c8.m_data[1];
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&curX_1,5,5,0);
      lookupPrec.coordBits.m_data[1] = curX_1;
      lookupPrec.coordBits.m_data[2] = cellNdx_1;
      lookupPrec.uvwBits.m_data[0] = local_2cc;
      local_22c._4_4_ = 10;
      lodPrec.rule = 6;
      if (bVar17) {
        lodPrec.rule = 4;
      }
      curY_1 = 0;
      while( true ) {
        sVar9 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::size
                          ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                           &curX);
        if ((int)sVar9 <= curY_1) break;
        pvVar10 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::
                  operator[]((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                             &curX,(long)curY_1);
        piVar11 = tcu::Vector<int,_4>::x(pvVar10);
        iVar2 = *piVar11;
        pvVar10 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::
                  operator[]((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                             &curX,(long)curY_1);
        piVar11 = tcu::Vector<int,_4>::y(pvVar10);
        iVar3 = *piVar11;
        pvVar10 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::
                  operator[]((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                             &curX,(long)curY_1);
        piVar11 = tcu::Vector<int,_4>::z(pvVar10);
        iVar4 = *piVar11;
        pvVar10 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::
                  operator[]((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                             &curX,(long)curY_1);
        piVar11 = tcu::Vector<int,_4>::w(pvVar10);
        height = *piVar11;
        idealDst._28_4_ = curY_1 % 6;
        glu::TextureTestUtil::computeQuadTexCoordCube
                  ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,
                   idealDst._28_4_);
        if (bVar17) {
          params_1.super_RenderParams.texType =
               params_1.super_RenderParams.texType | TEXTURETYPE_CUBE;
          params_1.super_RenderParams.samplerType =
               (SamplerType)iterate::s_projections[curY_1 % 4].m_data[0];
          params_1.super_RenderParams.flags = (deUint32)iterate::s_projections[curY_1 % 4].m_data[1]
          ;
          params_1.super_RenderParams.w.m_data._0_8_ =
               *(undefined8 *)(iterate::s_projections[curY_1 % 4].m_data + 2);
        }
        if (bVar18) {
          params_1.super_RenderParams.texType =
               params_1.super_RenderParams.texType | TEXTURETYPE_2D_ARRAY;
          params_1.super_RenderParams.w.m_data[2] = iterate::s_bias[curY_1 % 8];
        }
        iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
        pPVar14 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_03,iVar6))
        ;
        tcu::SurfaceAccess::SurfaceAccess
                  ((SurfaceAccess *)local_310,(Surface *)&errorMask.m_pixels.m_cap,pPVar14,iVar2,
                   iVar3,iVar4,height);
        pTVar7 = glu::TextureCube::getRefTexture(this->m_texture);
        tcu::TextureCube::operator_cast_to_TextureCubeView(&local_348,pTVar7);
        pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,
                             0);
        glu::TextureTestUtil::sampleTexture
                  ((SurfaceAccess *)local_310,&local_348,pvVar13,
                   (ReferenceParams *)&lookupPrec.colorMask);
        tcu::Surface::getAccess(&local_398,(Surface *)local_78);
        tcu::getSubregion((PixelBufferAccess *)&local_370,&local_398,iVar2,iVar3,iVar4,height);
        tcu::Surface::getAccess(&local_3e8,(Surface *)&errorMask.m_pixels.m_cap);
        tcu::getSubregion((PixelBufferAccess *)&local_3c0,&local_3e8,iVar2,iVar3,iVar4,height);
        tcu::Surface::getAccess(&local_438,(Surface *)&params_1.maxLevel);
        tcu::getSubregion(&local_410,&local_438,iVar2,iVar3,iVar4,height);
        pTVar7 = glu::TextureCube::getRefTexture(this->m_texture);
        tcu::TextureCube::operator_cast_to_TextureCubeView(&local_470,pTVar7);
        pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,
                             0);
        watchDog = tcu::TestContext::getWatchDog((this->super_TestCase).super_TestNode.m_testCtx);
        iVar2 = glu::TextureTestUtil::computeTextureLookupDiff
                          (&local_370,&local_3c0,&local_410,&local_470,pvVar13,
                           (ReferenceParams *)&lookupPrec.colorMask,
                           (LookupPrecision *)&lodPrec.derivateBits,(LodPrecision *)local_22c,
                           watchDog);
        params_1.baseLevel = iVar2 + params_1.baseLevel;
        curY_1 = curY_1 + 1;
      }
      if (0 < params_1.baseLevel) {
        pTVar15 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_5f0,pTVar15,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar16 = tcu::MessageBuilder::operator<<
                            (&local_5f0,(char (*) [41])"ERROR: Image verification failed, found ");
        pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,&params_1.baseLevel);
        pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [17])" invalid pixels!");
        tcu::MessageBuilder::operator<<(pMVar16,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_5f0);
      }
      pTVar15 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_650,"Result",&local_651);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_678,"Verification result",&local_679);
      tcu::LogImageSet::LogImageSet(&local_630,&local_650,&local_678);
      pTVar15 = tcu::TestLog::operator<<(pTVar15,&local_630);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"Rendered",&local_731)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_758,"Rendered image",&local_759);
      tcu::LogImage::LogImage
                (&local_710,&local_730,&local_758,(Surface *)local_78,QP_IMAGE_COMPRESSION_MODE_BEST
                );
      tcu::TestLog::operator<<(pTVar15,&local_710);
      tcu::LogImage::~LogImage(&local_710);
      std::__cxx11::string::~string((string *)&local_758);
      std::allocator<char>::~allocator(&local_759);
      std::__cxx11::string::~string((string *)&local_730);
      std::allocator<char>::~allocator(&local_731);
      tcu::LogImageSet::~LogImageSet(&local_630);
      std::__cxx11::string::~string((string *)&local_678);
      std::allocator<char>::~allocator(&local_679);
      std::__cxx11::string::~string((string *)&local_650);
      std::allocator<char>::~allocator(&local_651);
      if (0 < params_1.baseLevel) {
        pTVar15 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_810,"Reference",&local_811);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_838,"Ideal reference",&local_839);
        tcu::LogImage::LogImage
                  (&local_7f0,&local_810,&local_838,(Surface *)&errorMask.m_pixels.m_cap,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar15 = tcu::TestLog::operator<<(pTVar15,&local_7f0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8f0,"ErrorMask",&local_8f1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_918,"Error mask",&local_919);
        tcu::LogImage::LogImage
                  (&local_8d0,&local_8f0,(string *)local_918,(Surface *)&params_1.maxLevel,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::TestLog::operator<<(pTVar15,&local_8d0);
        tcu::LogImage::~LogImage(&local_8d0);
        std::__cxx11::string::~string((string *)local_918);
        std::allocator<char>::~allocator(&local_919);
        std::__cxx11::string::~string((string *)&local_8f0);
        std::allocator<char>::~allocator(&local_8f1);
        tcu::LogImage::~LogImage(&local_7f0);
        std::__cxx11::string::~string((string *)&local_838);
        std::allocator<char>::~allocator(&local_839);
        std::__cxx11::string::~string((string *)&local_810);
        std::allocator<char>::~allocator(&local_811);
      }
      pTVar15 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(pTVar15,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
      pcVar8 = "Image verification failed";
      if (params_1.baseLevel == 0) {
        pcVar8 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,
                 (byte)~(params_1.baseLevel == 0) & QP_TEST_RESULT_FAIL,pcVar8);
      tcu::Surface::~Surface((Surface *)&params_1.maxLevel);
      tcu::Surface::~Surface((Surface *)&errorMask.m_pixels.m_cap);
      std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
                ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX);
      tcu::Surface::~Surface((Surface *)local_78);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap);
      return STOP;
    }
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Too small viewport","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
             ,0x259);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

TextureCubeMipmapCase::IterateResult TextureCubeMipmapCase::iterate (void)
{
	const deUint32			magFilter			= GL_NEAREST;
	const int				texWidth			= m_texture->getRefTexture().getSize();
	const int				texHeight			= m_texture->getRefTexture().getSize();
	const int				defViewportWidth	= texWidth*2;
	const int				defViewportHeight	= texHeight*2;

	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	const RandomViewport	viewport			(m_renderCtx.getRenderTarget(), defViewportWidth, defViewportHeight, deStringHash(getName()));

	const bool				isProjected			= m_coordType == COORDTYPE_PROJECTED;
	const bool				useLodBias			= m_coordType == COORDTYPE_BASIC_BIAS;

	vector<float>			texCoord;
	tcu::Surface			renderedFrame		(viewport.width, viewport.height);

	// Bail out if rendertarget is too small.
	if (viewport.width < defViewportWidth/2 || viewport.height < defViewportHeight/2)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Upload texture data.
	m_texture->upload();

	// Bind gradient texture and setup sampler parameters.
	gl.bindTexture	(GL_TEXTURE_CUBE_MAP, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Compute grid.
	vector<IVec4> gridLayout;
	computeGridLayout(gridLayout, viewport.width, viewport.height);

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values \note Less agressive than in 2D case due to smaller quads.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 1.1f),
		Vec4(0.8f, 1.0f, 1.2f, 0.8f),
		Vec4(1.2f, 1.0f, 1.3f, 0.9f)
	};

	// Render with GL
	for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
	{
		const int			curX		= gridLayout[cellNdx].x();
		const int			curY		= gridLayout[cellNdx].y();
		const int			curW		= gridLayout[cellNdx].z();
		const int			curH		= gridLayout[cellNdx].w();
		const tcu::CubeFace	cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);
		RenderParams		params		(TEXTURETYPE_CUBE);

		DE_ASSERT(m_coordType != COORDTYPE_AFFINE); // Not supported.
		computeQuadTexCoordCube(texCoord, cubeFace);

		if (isProjected)
		{
			params.flags	|= ReferenceParams::PROJECTED;
			params.w		 = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];
		}

		if (useLodBias)
		{
			params.flags	|= ReferenceParams::USE_BIAS;
			params.bias		 = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];
		}

		// Render with GL.
		gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
		m_renderer.renderQuad(0, &texCoord[0], params);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

	// Read result.
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels");

	// Render reference and compare
	{
		tcu::Surface			referenceFrame		(viewport.width, viewport.height);
		tcu::Surface			errorMask			(viewport.width, viewport.height);
		int						numFailedPixels		= 0;
		ReferenceParams			params				(TEXTURETYPE_CUBE);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec				(tcu::LodPrecision::RULE_OPENGL);

		// Params for rendering reference
		params.sampler					= glu::mapGLSampler(m_wrapS, m_wrapT, m_minFilter, magFilter);
		params.sampler.seamlessCubeMap	= false;
		params.lodMode					= LODMODE_EXACT;

		// Comparison parameters
		lookupPrec.colorMask			= getCompareMask(m_renderCtx.getRenderTarget().getPixelFormat());
		lookupPrec.colorThreshold		= tcu::computeFixedPointThreshold(max(getBitsVec(m_renderCtx.getRenderTarget().getPixelFormat())-2, IVec4(0)));
		lookupPrec.coordBits			= isProjected ? tcu::IVec3(8) : tcu::IVec3(10);
		lookupPrec.uvwBits				= tcu::IVec3(5,5,0);
		lodPrec.derivateBits			= 10;
		lodPrec.lodBits					= isProjected ? 4 : 6;

		for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
		{
			const int				curX		= gridLayout[cellNdx].x();
			const int				curY		= gridLayout[cellNdx].y();
			const int				curW		= gridLayout[cellNdx].z();
			const int				curH		= gridLayout[cellNdx].w();
			const tcu::CubeFace		cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);

			DE_ASSERT(m_coordType != COORDTYPE_AFFINE); // Not supported.
			computeQuadTexCoordCube(texCoord, cubeFace);

			if (isProjected)
			{
				params.flags	|= ReferenceParams::PROJECTED;
				params.w		 = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];
			}

			if (useLodBias)
			{
				params.flags	|= ReferenceParams::USE_BIAS;
				params.bias		 = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];
			}

			// Render ideal reference.
			{
				tcu::SurfaceAccess idealDst(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), curX, curY, curW, curH);
				sampleTexture(idealDst, m_texture->getRefTexture(), &texCoord[0], params);
			}

			// Compare this cell
			numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
														m_texture->getRefTexture(), &texCoord[0], params,
														lookupPrec, lodPrec, m_testCtx.getWatchDog());
		}

		if (numFailedPixels > 0)
			m_testCtx.getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Verification result")
						   << TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_testCtx.getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
							   << TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_testCtx.getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image verification failed");
		}
	}

	return STOP;
}